

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  mz_zip_internal_state *pmVar4;
  undefined4 *puVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  mz_uint32 mVar12;
  mz_zip_array *pmVar13;
  mz_uint8 *pmVar14;
  bool bVar15;
  uint local_1cc;
  uint local_1ac;
  bool local_19d;
  uint local_18c;
  uint local_16c;
  bool local_159;
  mz_uint32 t_2;
  mz_uint32 t_1;
  int root_1;
  int child_1;
  mz_uint32 t;
  int root;
  int child;
  int end;
  int start;
  int size;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip_local;
  mz_uint8 r_3;
  mz_uint8 l_3;
  mz_uint r_len_3;
  mz_uint l_len_3;
  mz_uint8 *pR_3;
  mz_uint8 *pE_3;
  mz_uint8 *pL_3;
  byte local_c2;
  byte local_c1;
  mz_uint8 r_2;
  mz_uint8 l_2;
  mz_uint r_len_2;
  mz_uint l_len_2;
  mz_uint8 *pR_2;
  mz_uint8 *pE_2;
  mz_uint8 *pL_2;
  byte local_82;
  byte local_81;
  mz_uint8 r_1;
  mz_uint8 l_1;
  mz_uint r_len_1;
  mz_uint l_len_1;
  mz_uint8 *pR_1;
  mz_uint8 *pE_1;
  mz_uint8 *pL_1;
  byte local_42;
  byte local_41;
  mz_uint8 r;
  mz_uint8 l;
  mz_uint r_len;
  mz_uint l_len;
  mz_uint8 *pR;
  mz_uint8 *pE;
  mz_uint8 *pL;
  
  pmVar4 = pZip->m_pState;
  pmVar13 = &pmVar4->m_central_dir_offsets;
  puVar5 = (undefined4 *)(pmVar4->m_sorted_central_dir_offsets).m_p;
  root = pZip->m_total_files;
  child = (int)(root - 2U) >> 1;
  do {
    if (child < 0) {
      do {
        root = root - 1;
        if (root < 1) {
          return;
        }
        t_2 = 0;
        uVar3 = puVar5[root];
        puVar5[root] = *puVar5;
        *puVar5 = uVar3;
        while( true ) {
          iVar8 = t_2 * 2;
          iVar9 = iVar8 + 1;
          if (root <= iVar9) break;
          local_19d = false;
          if (iVar8 + 2 < root) {
            pvVar6 = (pmVar4->m_central_dir).m_p;
            uVar1 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[iVar9] * 4);
            pvVar7 = (pmVar4->m_central_dir).m_p;
            uVar2 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[iVar8 + 2] * 4);
            uVar10 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar1 + 0x1c);
            uVar11 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar2 + 0x1c);
            local_c1 = 0;
            local_c2 = 0;
            pE_2 = (mz_uint8 *)((long)pvVar6 + (ulong)uVar1 + 0x2e);
            _r_len_2 = (byte *)((long)pvVar7 + (ulong)uVar2 + 0x2e);
            local_1ac = uVar11;
            if (uVar10 < uVar11) {
              local_1ac = uVar10;
            }
            pmVar14 = pE_2 + local_1ac;
            for (; pE_2 < pmVar14; pE_2 = pE_2 + 1) {
              if ((*pE_2 < 0x41) || (0x5a < *pE_2)) {
                local_c1 = *pE_2;
              }
              else {
                local_c1 = *pE_2 + 0x20;
              }
              if ((*_r_len_2 < 0x41) || (0x5a < *_r_len_2)) {
                local_c2 = *_r_len_2;
              }
              else {
                local_c2 = *_r_len_2 + 0x20;
              }
              if (local_c1 != local_c2) break;
              _r_len_2 = _r_len_2 + 1;
            }
            if (pE_2 == pmVar14) {
              local_19d = uVar10 < uVar11;
            }
            else {
              local_19d = local_c1 < local_c2;
            }
          }
          mVar12 = (uint)local_19d + iVar9;
          pvVar6 = (pmVar4->m_central_dir).m_p;
          uVar1 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[(int)t_2] * 4);
          pvVar7 = (pmVar4->m_central_dir).m_p;
          uVar2 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[(int)mVar12] * 4);
          uVar10 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar1 + 0x1c);
          uVar11 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar2 + 0x1c);
          pZip_local._7_1_ = 0;
          pZip_local._6_1_ = 0;
          pE_3 = (mz_uint8 *)((long)pvVar6 + (ulong)uVar1 + 0x2e);
          _r_len_3 = (byte *)((long)pvVar7 + (ulong)uVar2 + 0x2e);
          local_1cc = uVar11;
          if (uVar10 < uVar11) {
            local_1cc = uVar10;
          }
          pmVar14 = pE_3 + local_1cc;
          for (; pE_3 < pmVar14; pE_3 = pE_3 + 1) {
            if ((*pE_3 < 0x41) || (0x5a < *pE_3)) {
              pZip_local._7_1_ = *pE_3;
            }
            else {
              pZip_local._7_1_ = *pE_3 + 0x20;
            }
            if ((*_r_len_3 < 0x41) || (0x5a < *_r_len_3)) {
              pZip_local._6_1_ = *_r_len_3;
            }
            else {
              pZip_local._6_1_ = *_r_len_3 + 0x20;
            }
            if (pZip_local._7_1_ != pZip_local._6_1_) break;
            _r_len_3 = _r_len_3 + 1;
          }
          if (pE_3 == pmVar14) {
            bVar15 = uVar10 < uVar11;
          }
          else {
            bVar15 = pZip_local._7_1_ < pZip_local._6_1_;
          }
          if (!bVar15) break;
          uVar3 = puVar5[(int)t_2];
          puVar5[(int)t_2] = puVar5[(int)mVar12];
          puVar5[(int)mVar12] = uVar3;
          t_2 = mVar12;
        }
      } while( true );
    }
    child_1 = child;
    while( true ) {
      iVar8 = child_1 * 2;
      iVar9 = iVar8 + 1;
      if (root <= iVar9) break;
      local_159 = false;
      if (iVar8 + 2 < root) {
        pvVar6 = (pmVar4->m_central_dir).m_p;
        uVar1 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[iVar9] * 4);
        pvVar7 = (pmVar4->m_central_dir).m_p;
        uVar2 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[iVar8 + 2] * 4);
        uVar10 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar1 + 0x1c);
        uVar11 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar2 + 0x1c);
        local_41 = 0;
        local_42 = 0;
        pE = (mz_uint8 *)((long)pvVar6 + (ulong)uVar1 + 0x2e);
        _r_len = (byte *)((long)pvVar7 + (ulong)uVar2 + 0x2e);
        local_16c = uVar11;
        if (uVar10 < uVar11) {
          local_16c = uVar10;
        }
        pmVar14 = pE + local_16c;
        for (; pE < pmVar14; pE = pE + 1) {
          if ((*pE < 0x41) || (0x5a < *pE)) {
            local_41 = *pE;
          }
          else {
            local_41 = *pE + 0x20;
          }
          if ((*_r_len < 0x41) || (0x5a < *_r_len)) {
            local_42 = *_r_len;
          }
          else {
            local_42 = *_r_len + 0x20;
          }
          if (local_41 != local_42) break;
          _r_len = _r_len + 1;
        }
        if (pE == pmVar14) {
          local_159 = uVar10 < uVar11;
        }
        else {
          local_159 = local_41 < local_42;
        }
      }
      iVar9 = (uint)local_159 + iVar9;
      pvVar6 = (pmVar4->m_central_dir).m_p;
      uVar1 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[child_1] * 4);
      pvVar7 = (pmVar4->m_central_dir).m_p;
      uVar2 = *(uint *)((long)pmVar13->m_p + (ulong)(uint)puVar5[iVar9] * 4);
      uVar10 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar1 + 0x1c);
      uVar11 = (uint)*(ushort *)((long)pvVar7 + (ulong)uVar2 + 0x1c);
      local_81 = 0;
      local_82 = 0;
      pE_1 = (mz_uint8 *)((long)pvVar6 + (ulong)uVar1 + 0x2e);
      _r_len_1 = (byte *)((long)pvVar7 + (ulong)uVar2 + 0x2e);
      local_18c = uVar11;
      if (uVar10 < uVar11) {
        local_18c = uVar10;
      }
      pmVar14 = pE_1 + local_18c;
      for (; pE_1 < pmVar14; pE_1 = pE_1 + 1) {
        if ((*pE_1 < 0x41) || (0x5a < *pE_1)) {
          local_81 = *pE_1;
        }
        else {
          local_81 = *pE_1 + 0x20;
        }
        if ((*_r_len_1 < 0x41) || (0x5a < *_r_len_1)) {
          local_82 = *_r_len_1;
        }
        else {
          local_82 = *_r_len_1 + 0x20;
        }
        if (local_81 != local_82) break;
        _r_len_1 = _r_len_1 + 1;
      }
      if (pE_1 == pmVar14) {
        bVar15 = uVar10 < uVar11;
      }
      else {
        bVar15 = local_81 < local_82;
      }
      if (!bVar15) break;
      uVar3 = puVar5[child_1];
      puVar5[child_1] = puVar5[iVar9];
      puVar5[iVar9] = uVar3;
      child_1 = iVar9;
    }
    child = child + -1;
  } while( true );
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0)
  {
    int child, root = start;
    for ( ; ; )
    {
      if ((child = (root << 1) + 1) >= size)
        break;
      child += (((child + 1) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]); root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0)
  {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for ( ; ; )
    {
      if ((child = (root << 1) + 1) >= end)
        break;
      child += (((child + 1) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]); root = child;
    }
    end--;
  }
}